

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

bool __thiscall BCLog::Logger::WillLogCategory(Logger *this,LogFlags category)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ((this->m_categories).super___atomic_base<unsigned_long>._M_i & category) != NONE;
  }
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::WillLogCategory(BCLog::LogFlags category) const
{
    return (m_categories.load(std::memory_order_relaxed) & category) != 0;
}